

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpendableReload.cpp
# Opt level: O0

bool __thiscall DIS::ExpendableReload::operator==(ExpendableReload *this,ExpendableReload *rhs)

{
  bool local_19;
  bool ivarsEqual;
  ExpendableReload *rhs_local;
  ExpendableReload *this_local;
  
  local_19 = EntityType::operator==(&this->_expendable,&rhs->_expendable);
  if (this->_station != rhs->_station) {
    local_19 = false;
  }
  if (this->_standardQuantity != rhs->_standardQuantity) {
    local_19 = false;
  }
  if (this->_maximumQuantity != rhs->_maximumQuantity) {
    local_19 = false;
  }
  if (this->_standardQuantityReloadTime != rhs->_standardQuantityReloadTime) {
    local_19 = false;
  }
  if (this->_maximumQuantityReloadTime != rhs->_maximumQuantityReloadTime) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool ExpendableReload::operator ==(const ExpendableReload& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_expendable == rhs._expendable) ) ivarsEqual = false;
     if( ! (_station == rhs._station) ) ivarsEqual = false;
     if( ! (_standardQuantity == rhs._standardQuantity) ) ivarsEqual = false;
     if( ! (_maximumQuantity == rhs._maximumQuantity) ) ivarsEqual = false;
     if( ! (_standardQuantityReloadTime == rhs._standardQuantityReloadTime) ) ivarsEqual = false;
     if( ! (_maximumQuantityReloadTime == rhs._maximumQuantityReloadTime) ) ivarsEqual = false;

    return ivarsEqual;
 }